

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day04b.cpp
# Opt level: O2

int day4b::northpole_room_id(string *input)

{
  bool bVar1;
  int id;
  istream *piVar2;
  string line;
  string local_1f0;
  string name;
  istringstream stream;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)input,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    piVar2 = std::operator>>((istream *)&stream,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      id = 0;
      break;
    }
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&name,line._M_dataplus._M_p,
               line._M_dataplus._M_p + (line._M_string_length - 0xb));
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_1f0,line._M_dataplus._M_p + (line._M_string_length - 10),
               line._M_dataplus._M_p + (line._M_string_length - 7));
    id = std::__cxx11::stoi(&local_1f0,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_1f0);
    decipher_name(&name,id);
    bVar1 = std::operator==(&name,"northpole-object-storage");
    std::__cxx11::string::~string((string *)&name);
  } while (!bVar1);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
  return id;
}

Assistant:

int northpole_room_id(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		while(stream >> line) {
			std::string name{line.begin(), line.end() - 11};
			int id = std::stoi(std::string{line.end() - 10, line.end() - 7});
			decipher_name(name, id);
			if(name == "northpole-object-storage") {
				return id;
			}
		}
		return 0;
	}